

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<Fad<double>,_20>::Resize
          (TPZManVector<Fad<double>,_20> *this,int64_t newsize,Fad<double> *object)

{
  ostream *poVar1;
  ulong *puVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  if (-1 < newsize) {
    lVar5 = (this->super_TPZVec<Fad<double>_>).fNElements;
    if (lVar5 != newsize) {
      lVar6 = (this->super_TPZVec<Fad<double>_>).fNAlloc;
      if (lVar6 < newsize) {
        if ((ulong)newsize < 0x15) {
          pFVar3 = this->fExtAlloc;
          lVar6 = 0;
          for (lVar7 = 0; lVar7 < lVar5; lVar7 = lVar7 + 1) {
            Fad<double>::operator=
                      ((Fad<double> *)((long)&pFVar3->val_ + lVar6),
                       (Fad<double> *)
                       ((long)&((this->super_TPZVec<Fad<double>_>).fStore)->val_ + lVar6));
            lVar5 = (this->super_TPZVec<Fad<double>_>).fNElements;
            lVar6 = lVar6 + 0x20;
          }
          lVar5 = lVar7;
          if (lVar7 < newsize) {
            lVar5 = newsize;
          }
          pFVar4 = (Fad<double> *)((long)&pFVar3->val_ + lVar6);
          for (; lVar7 != lVar5; lVar5 = lVar5 + -1) {
            Fad<double>::operator=(pFVar4,object);
            pFVar4 = pFVar4 + 1;
          }
          pFVar4 = (this->super_TPZVec<Fad<double>_>).fStore;
          if (pFVar4 != (Fad<double> *)0x0 && pFVar4 != pFVar3) {
            dVar9 = pFVar4[-1].defaultVal;
            if (dVar9 != 0.0) {
              lVar5 = (long)dVar9 << 5;
              do {
                Fad<double>::~Fad((Fad<double> *)((long)&pFVar4[-1].val_ + lVar5));
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != 0);
            }
            operator_delete__(&pFVar4[-1].defaultVal,(long)dVar9 << 5 | 8);
          }
          (this->super_TPZVec<Fad<double>_>).fStore = pFVar3;
          (this->super_TPZVec<Fad<double>_>).fNElements = newsize;
          (this->super_TPZVec<Fad<double>_>).fNAlloc = 0x14;
        }
        else {
          dVar9 = (double)lVar6 * 1.2;
          uVar8 = (long)dVar9;
          if (dVar9 < (double)newsize) {
            uVar8 = newsize;
          }
          puVar2 = (ulong *)operator_new__(-(ulong)(uVar8 >> 0x3b != 0) | uVar8 * 0x20 | 8);
          *puVar2 = uVar8;
          pFVar3 = (Fad<double> *)(puVar2 + 1);
          if (uVar8 != 0) {
            lVar5 = 0;
            pFVar4 = pFVar3;
            do {
              Fad<double>::Fad(pFVar4);
              lVar5 = lVar5 + -0x20;
              pFVar4 = pFVar4 + 1;
            } while (-lVar5 != uVar8 * 0x20);
          }
          lVar6 = 0;
          for (lVar5 = 0; lVar5 < (this->super_TPZVec<Fad<double>_>).fNElements; lVar5 = lVar5 + 1)
          {
            Fad<double>::operator=
                      ((Fad<double> *)((long)&pFVar3->val_ + lVar6),
                       (Fad<double> *)
                       ((long)&((this->super_TPZVec<Fad<double>_>).fStore)->val_ + lVar6));
            lVar6 = lVar6 + 0x20;
          }
          lVar7 = lVar5;
          if (lVar5 < newsize) {
            lVar7 = newsize;
          }
          pFVar4 = (Fad<double> *)((long)&pFVar3->val_ + lVar6);
          for (; lVar5 != lVar7; lVar7 = lVar7 + -1) {
            Fad<double>::operator=(pFVar4,object);
            pFVar4 = pFVar4 + 1;
          }
          pFVar4 = (this->super_TPZVec<Fad<double>_>).fStore;
          if (pFVar4 != (Fad<double> *)0x0 && pFVar4 != this->fExtAlloc) {
            dVar9 = pFVar4[-1].defaultVal;
            if (dVar9 != 0.0) {
              lVar5 = (long)dVar9 << 5;
              do {
                Fad<double>::~Fad((Fad<double> *)((long)&pFVar4[-1].val_ + lVar5));
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != 0);
            }
            operator_delete__(&pFVar4[-1].defaultVal,(long)dVar9 << 5 | 8);
          }
          (this->super_TPZVec<Fad<double>_>).fStore = pFVar3;
          (this->super_TPZVec<Fad<double>_>).fNElements = newsize;
          (this->super_TPZVec<Fad<double>_>).fNAlloc = uVar8;
        }
      }
      else {
        lVar6 = lVar5 << 5;
        for (; lVar5 < newsize; lVar5 = lVar5 + 1) {
          Fad<double>::operator=
                    ((Fad<double> *)
                     ((long)&((this->super_TPZVec<Fad<double>_>).fStore)->val_ + lVar6),object);
          lVar6 = lVar6 + 0x20;
        }
        (this->super_TPZVec<Fad<double>_>).fNElements = newsize;
      }
    }
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}